

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O2

void __thiscall antlr::CharScanner::matchRange(CharScanner *this,int c1,int c2)

{
  int c;
  MismatchedCharException *this_00;
  
  c = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
  if ((c1 <= c) && (c <= c2)) {
    (*(this->super_TokenStream)._vptr_TokenStream[8])(this);
    return;
  }
  this_00 = (MismatchedCharException *)__cxa_allocate_exception(0x90);
  MismatchedCharException::MismatchedCharException(this_00,c,c1,c2,false,this);
  __cxa_throw(this_00,&MismatchedCharException::typeinfo,
              MismatchedCharException::~MismatchedCharException);
}

Assistant:

virtual void matchRange(int c1, int c2)
	{
		int la_1 = LA(1);

		if ( la_1 < c1 || la_1 > c2 )
			throw MismatchedCharException(la_1, c1, c2, false, this);

		consume();
	}